

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_ListCsvDisabled_Test::~ClCommandLine_ListCsvDisabled_Test
          (ClCommandLine_ListCsvDisabled_Test *this)

{
  ClCommandLine_ListCsvDisabled_Test *this_local;
  
  ~ClCommandLine_ListCsvDisabled_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, ListCsvDisabled) {
    list<std::string> opt{"opt", positional};

    this->add ("progname", "a,b");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_THAT (opt, ::testing::ElementsAre ("a,b"));
}